

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall icu_63::MessagePattern::MessagePattern(MessagePattern *this,MessagePattern *other)

{
  UBool UVar1;
  UErrorCode local_28 [2];
  UErrorCode errorCode;
  MessagePattern *local_18;
  MessagePattern *other_local;
  MessagePattern *this_local;
  
  local_18 = other;
  other_local = this;
  UObject::UObject(&this->super_UObject,&other->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_005009d8;
  this->aposMode = local_18->aposMode;
  UnicodeString::UnicodeString(&this->msg,&local_18->msg);
  this->partsList = (MessagePatternPartsList *)0x0;
  this->parts = (Part *)0x0;
  this->partsLength = 0;
  this->numericValuesList = (MessagePatternDoubleList *)0x0;
  this->numericValues = (double *)0x0;
  this->numericValuesLength = 0;
  this->hasArgNames = local_18->hasArgNames;
  this->hasArgNumbers = local_18->hasArgNumbers;
  this->needsAutoQuoting = local_18->needsAutoQuoting;
  local_28[0] = U_ZERO_ERROR;
  UVar1 = copyStorage(this,local_18,local_28);
  if (UVar1 == '\0') {
    clear(this);
  }
  return;
}

Assistant:

MessagePattern::MessagePattern(const MessagePattern &other)
        : UObject(other), aposMode(other.aposMode), msg(other.msg),
          partsList(NULL), parts(NULL), partsLength(0),
          numericValuesList(NULL), numericValues(NULL), numericValuesLength(0),
          hasArgNames(other.hasArgNames), hasArgNumbers(other.hasArgNumbers),
          needsAutoQuoting(other.needsAutoQuoting) {
    UErrorCode errorCode=U_ZERO_ERROR;
    if(!copyStorage(other, errorCode)) {
        clear();
    }
}